

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameData.cpp
# Opt level: O1

bool __thiscall GameData::IsGameOver(GameData *this)

{
  ulong uVar1;
  char cVar2;
  int (*paiVar3) [4];
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  ofstream TempFile;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  paiVar3 = this->num;
  bVar9 = false;
  uVar4 = 0;
LAB_001031db:
  paiVar3 = paiVar3 + 1;
  iVar6 = this->num[uVar4][0];
  if (iVar6 != 0) {
    uVar1 = uVar4 + 1;
    lVar5 = -3;
    bVar8 = false;
    uVar7 = 0;
    do {
      if (uVar4 == 0) {
LAB_00103211:
        if ((*paiVar3)[lVar5 + 3] == iVar6) goto LAB_00103252;
      }
      else {
        if (*(int *)((long)(paiVar3 + -2) + 0xc + lVar5 * 4) == iVar6) goto LAB_00103252;
        if (uVar4 != 3) goto LAB_00103211;
      }
      if (((lVar5 != -3) && (paiVar3[-1][lVar5 + 2] == iVar6)) ||
         ((uVar7 != 3 && ((*paiVar3)[lVar5] == iVar6)))) goto LAB_00103252;
      if (uVar7 + 1 == 4) goto LAB_00103258;
      bVar8 = 2 < uVar7;
      iVar6 = (*paiVar3)[lVar5];
      lVar5 = lVar5 + 1;
      uVar7 = uVar7 + 1;
      if (iVar6 == 0) goto LAB_00103252;
    } while( true );
  }
  goto LAB_00103272;
LAB_00103252:
  if (!bVar8) {
LAB_00103272:
    if (!bVar9) {
      return bVar9;
    }
    goto LAB_0010327b;
  }
LAB_00103258:
  bVar9 = 2 < uVar4;
  uVar4 = uVar1;
  if (uVar1 == 4) {
LAB_0010327b:
    iVar6 = this->score;
    if (this->score < this->my_best) {
      iVar6 = this->my_best;
    }
    this->my_best = iVar6;
    std::ofstream::ofstream(&local_210,"2048GAME.data",_S_out|_S_bin);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_bf4f,0x1b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
    }
    else {
      std::ostream::operator<<((ostream *)&local_210,this->my_best);
    }
    std::ofstream::close();
    local_210 = _VTT;
    *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_208);
    std::ios_base::~ios_base(local_118);
    return bVar9;
  }
  goto LAB_001031db;
}

Assistant:

bool GameData::IsGameOver() {
    for (int i = 0; i < 4; i++) {
        for (int j = 0; j < 4; j++) {
            if (num[i][j] == 0)return false;
            if (i - 1 >= 0 && num[i - 1][j] == num[i][j])return false;
            if (i + 1 < 4 && num[i + 1][j] == num[i][j])return false;
            if (j - 1 >= 0 && num[i][j - 1] == num[i][j])return false;
            if (j + 1 < 4 && num[i][j + 1] == num[i][j])return false;
        }
    }
    my_best = std::max(my_best, score);
    std::ofstream TempFile("2048GAME.data",std::ios::out | std::ios::binary);
    if(TempFile.is_open())
        TempFile<<my_best;
    else
        std::cout<<"存储最佳分数失败！"<<std::endl;
    TempFile.close();
    return true;
}